

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O1

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,string *binDir)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  unsigned_long uVar5;
  char *pcVar6;
  long *plVar7;
  ulong dindex;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  string m;
  Directory dir;
  string fullPath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Directory local_90;
  string local_88;
  cmCoreTryCompile *local_68;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  if (binDir->_M_string_length != 0) {
    local_68 = this;
    lVar4 = std::__cxx11::string::find((char *)binDir,0x5d21f2,0);
    if (lVar4 == -1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp:",
                     binDir);
      cmSystemTools::Error
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
        operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
      }
    }
    else {
      cmsys::Directory::Directory(&local_90);
      cmsys::Directory::Load(&local_90,binDir);
      local_60._24_8_ = local_60 + 8;
      local_60._8_4_ = _S_red;
      dindex = 0;
      local_60._16_8_ = (_Base_ptr)0x0;
      local_38 = 0;
      local_40 = (_Base_ptr)local_60._24_8_;
      while( true ) {
        uVar5 = cmsys::Directory::GetNumberOfFiles(&local_90);
        if (uVar5 <= dindex) break;
        pcVar6 = cmsys::Directory::GetFile(&local_90,dindex);
        iVar3 = strcmp(pcVar6,".");
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar6,"..");
          if (iVar3 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_88,pcVar6,(allocator<char> *)&local_b0);
            pVar8 = std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)local_60,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              pcVar1 = (binDir->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,pcVar1,pcVar1 + binDir->_M_string_length);
              pcVar6 = (char *)std::__cxx11::string::append((char *)&local_b0);
              plVar7 = (long *)std::__cxx11::string::append(pcVar6);
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_88,*plVar7,plVar7[1] + *plVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              bVar2 = cmsys::SystemTools::FileIsDirectory(&local_88);
              if (bVar2) {
                CleanupFiles(local_68,&local_88);
                cmsys::SystemTools::RemoveADirectory(&local_88);
              }
              else {
                bVar2 = cmsys::SystemTools::RemoveFile(&local_88);
                if (!bVar2) {
                  std::operator+(&local_b0,"Remove failed on file: ",&local_88);
                  cmSystemTools::ReportLastSystemError(local_b0._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p,
                                    local_b0.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
        }
        dindex = dindex + 1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60);
      cmsys::Directory::~Directory(&local_90);
    }
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(std::string const& binDir)
{
  if (binDir.empty()) {
    return;
  }

  if (binDir.find("CMakeTmp") == std::string::npos) {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp:" +
      binDir);
    return;
  }

  cmsys::Directory dir;
  dir.Load(binDir);
  std::set<std::string> deletedFiles;
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0) {
      if (deletedFiles.insert(fileName).second) {
        std::string const fullPath =
          std::string(binDir).append("/").append(fileName);
        if (cmSystemTools::FileIsDirectory(fullPath)) {
          this->CleanupFiles(fullPath);
          cmSystemTools::RemoveADirectory(fullPath);
        } else {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          while (!cmSystemTools::RemoveFile(fullPath) && --retry.Count &&
                 cmSystemTools::FileExists(fullPath)) {
            cmSystemTools::Delay(retry.Delay);
          }
          if (retry.Count == 0)
#else
          if (!cmSystemTools::RemoveFile(fullPath))
#endif
          {
            std::string m = "Remove failed on file: " + fullPath;
            cmSystemTools::ReportLastSystemError(m.c_str());
          }
        }
      }
    }
  }
}